

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_16f66::reduceY<float>
               (TypedImageChannel<float> *channel0,TypedImageChannel<float> *channel1,bool filter,
               Extrapolation ext,bool odd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Image *pIVar4;
  float *pfVar5;
  byte in_DL;
  ImageChannel *in_RSI;
  ImageChannel *in_RDI;
  double y_00;
  int x_1;
  int y_1;
  int offset;
  int x;
  int y;
  double f;
  int h1;
  int h0;
  int w1;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  
  pIVar4 = ImageChannel::image(in_RSI);
  iVar1 = Image::width(pIVar4);
  pIVar4 = ImageChannel::image(in_RDI);
  iVar2 = Image::height(pIVar4);
  pIVar4 = ImageChannel::image(in_RSI);
  iVar3 = Image::height(pIVar4);
  if ((in_DL & 1) == 0) {
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
        pfVar5 = TypedImageChannel<float>::operator()
                           ((TypedImageChannel<float> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa4 = *pfVar5;
        pfVar5 = TypedImageChannel<float>::operator()
                           ((TypedImageChannel<float> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        *pfVar5 = in_stack_ffffffffffffffa4;
      }
    }
  }
  else {
    if (iVar3 < 2) {
      y_00 = 1.0;
    }
    else {
      y_00 = (double)(iVar2 + -2) / (double)(iVar3 + -1);
    }
    for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        in_stack_ffffffffffffffac =
             filterY<float>((TypedImageChannel<float> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,y_00,
                            (Extrapolation)in_stack_ffffffffffffffac);
        pfVar5 = TypedImageChannel<float>::operator()
                           ((TypedImageChannel<float> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
        *pfVar5 = in_stack_ffffffffffffffac;
      }
    }
  }
  return;
}

Assistant:

void
reduceY (
    const TypedImageChannel<T>& channel0,
    TypedImageChannel<T>&       channel1,
    bool                        filter,
    Extrapolation               ext,
    bool                        odd)
{
    //
    // Shrink an image channel, channel0, vertically
    // by a factor of 2, and store the result in channel1.
    //

    int w1 = channel1.image ().width ();
    int h0 = channel0.image ().height ();
    int h1 = channel1.image ().height ();

    if (filter)
    {
        //
        // Low-pass filter and resample.
        // For pixels (x, 0) and (x, h1 - 1) in channel 1,
        // the low-pass filter in channel0 is centered on
        // pixels (x, 0.5) and (x, h0 - 1.5) respectively.
        //

        double f = (h1 > 1) ? double (h0 - 2) / (h1 - 1) : 1;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = filterY (channel0, h0, x, y * f, ext);
    }
    else
    {
        //
        // Resample, skipping every other pixel, without
        // low-pass filtering.  In order to keep the image
        // from sliding towards the top if the channel is
        // resampled repeatedly, we skip the top pixel of
        // every column on even passes, and the bottom pixel
        // on odd passes.
        //

        int offset = odd ? ((h0 - 1) - 2 * (h1 - 1)) : 0;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = channel0 (x, 2 * y + offset);
    }
}